

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging_tests.c
# Opt level: O0

void failure_reported_and_exception_thrown_when_messaging_would_block(void)

{
  undefined4 uVar1;
  char panic_message [1000];
  int loop;
  int messaging;
  int LOOPS;
  int iVar2;
  int in_stack_fffffffffffffbfc;
  char *in_stack_fffffffffffffc00;
  char *actual_string;
  char local_3f8 [4];
  int in_stack_fffffffffffffc0c;
  char *in_stack_fffffffffffffc10;
  int local_c;
  
  uVar1 = start_cgreen_messaging(0x21);
  signal_received = 0;
  signal(0xd,catch_signal);
  panic_set_output_buffer(local_3f8);
  local_c = 0;
  while ((local_c < 0x10001 && (send_cgreen_message(uVar1,99), signal_received != 1))) {
    local_c = local_c + 1;
  }
  iVar2 = signal_received;
  create_equal_to_value_constraint(1,"1");
  cgreen::assert_that_<int>
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,in_stack_fffffffffffffc00,
             in_stack_fffffffffffffbfc,(Constraint *)0x11a6d9);
  create_less_than_value_constraint(0x10001,"LOOPS");
  cgreen::assert_that_<int>
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,in_stack_fffffffffffffc00,local_c,
             (Constraint *)0x11a714);
  actual_string = local_3f8;
  create_contains_string_constraint("Too many assertions","\"Too many assertions\"");
  cgreen::assert_that_<char*>
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,actual_string,
             (char *)CONCAT44(local_c,iVar2),(Constraint *)0x11a751);
  return;
}

Assistant:

Ensure(failure_reported_and_exception_thrown_when_messaging_would_block) {
    const int LOOPS = 65537;
    int messaging = start_cgreen_messaging(33);
    int loop;
    char panic_message[1000];

    signal_received = 0;
    signal(SIGPIPE, catch_signal);

    panic_set_output_buffer(panic_message);

    for (loop = 0; loop < LOOPS; loop++) {
        send_cgreen_message(messaging, 99);
        if (signal_received == 1)
            break;
    }

    assert_that(signal_received, is_equal_to(1));
    assert_that(loop, is_less_than(LOOPS));
    assert_that(panic_message, contains_string("Too many assertions"));
}